

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O1

void __thiscall
rsg::DeclarationStatement::execute(DeclarationStatement *this,ExecutionContext *execCtx)

{
  int iVar1;
  void *__src;
  ExecValueAccess EVar2;
  
  if (this->m_expression != (Expression *)0x0) {
    (*this->m_expression->_vptr_Expression[4])();
    (*this->m_expression->_vptr_Expression[5])();
    EVar2 = ExecutionContext::getValue(execCtx,this->m_variable);
    iVar1 = VariableType::getScalarSize(EVar2.super_ConstStridedValueAccess<64>.m_type);
    if ((iVar1 != 0) && (iVar1 << 6 != 0)) {
      memmove(EVar2.super_ConstStridedValueAccess<64>.m_value,__src,(long)(iVar1 << 6) << 2);
      return;
    }
  }
  return;
}

Assistant:

void DeclarationStatement::execute (ExecutionContext& execCtx) const
{
	if (m_expression)
	{
		m_expression->evaluate(execCtx);
		execCtx.getValue(m_variable) = m_expression->getValue().value();
	}
}